

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2fe304::BuildFileImpl::error(BuildFileImpl *this,StringRef message)

{
  StringRef message_00;
  undefined8 uVar1;
  SMRange local_50;
  StringRef local_40;
  BuildFileImpl *local_30;
  BuildFileImpl *this_local;
  StringRef message_local;
  
  message_local.Data = (char *)message.Length;
  this_local = (BuildFileImpl *)message.Data;
  local_30 = this;
  message_local.Length = (size_t)this;
  uVar1 = std::__cxx11::string::data();
  local_40.Data = (char *)uVar1;
  uVar1 = std::__cxx11::string::length();
  local_40.Length = uVar1;
  memset(&local_50,0,0x10);
  llvm::SMRange::SMRange(&local_50);
  message_00.Length = (size_t)message_local.Data;
  message_00.Data = (char *)this_local;
  error(this,local_40,local_50,message_00);
  return;
}

Assistant:

void error(StringRef message) {
    error(mainFilename, {}, message);
  }